

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoAssignUnique(Gia_IsoMan_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Entry;
  ulong uVar2;
  int i;
  
  p->nSingles = 0;
  p->vClasses2->nSize = 0;
  i = 1;
  do {
    p_00 = p->vClasses;
    if (p_00->nSize <= i) {
      p->vClasses = p->vClasses2;
      p->vClasses2 = p_00;
      p->nEntries = p->nEntries - p->nSingles;
      return;
    }
    iVar1 = Vec_IntEntry(p_00,i + -1);
    Entry = Vec_IntEntry(p->vClasses,i);
    if (Entry == 1) {
      uVar2 = p->pStoreW[iVar1] >> 0x20;
      if (p->pUniques[uVar2] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                      ,0x112,"void Gia_IsoAssignUnique(Gia_IsoMan_t *)");
      }
      iVar1 = p->nUniques;
      p->nUniques = iVar1 + 1;
      p->pUniques[uVar2] = iVar1;
      p->nSingles = p->nSingles + 1;
    }
    else {
      Vec_IntPush(p->vClasses2,iVar1);
      Vec_IntPush(p->vClasses2,Entry);
    }
    i = i + 2;
  } while( true );
}

Assistant:

void Gia_IsoAssignUnique( Gia_IsoMan_t * p )
{
    int i, iBegin, nSize;
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
        }
    }
    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
}